

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer
          (CategoricalCrossEntropyLossLayer *this,CategoricalCrossEntropyLossLayer *from)

{
  void *pvVar1;
  string *psVar2;
  
  (this->super_MessageLite)._vptr_MessageLite =
       (_func_int **)&PTR__CategoricalCrossEntropyLossLayer_003d91c8;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  (this->input_).ptr_ = (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_
  ;
  psVar2 = (from->input_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->input_,psVar2);
  }
  (this->target_).ptr_ =
       (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
  psVar2 = (from->target_).ptr_;
  if ((psVar2 != (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) &&
     (psVar2->_M_string_length != 0)) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&this->target_,psVar2);
  }
  return;
}

Assistant:

CategoricalCrossEntropyLossLayer::CategoricalCrossEntropyLossLayer(const CategoricalCrossEntropyLossLayer& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  input_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.input().size() > 0) {
    input_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.input_);
  }
  target_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.target().size() > 0) {
    target_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.target_);
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.CategoricalCrossEntropyLossLayer)
}